

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QMap<int,_QVariant> __thiscall QTableModel::itemData(QTableModel *this,QModelIndex *index)

{
  QWidgetItemData *pQVar1;
  QTableWidgetItem *pQVar2;
  QModelIndex *in_RDX;
  ulong uVar3;
  long lVar4;
  
  *(undefined8 *)this = 0;
  pQVar2 = item((QTableModel *)index,in_RDX);
  if ((pQVar2 != (QTableWidgetItem *)0x0) && ((pQVar2->values).d.size != 0)) {
    lVar4 = 8;
    uVar3 = 0;
    do {
      pQVar1 = (pQVar2->values).d.ptr;
      QMap<int,_QVariant>::insert
                ((QMap<int,_QVariant> *)this,(int *)((long)pQVar1 + lVar4 + -8),
                 (QVariant *)((long)&pQVar1->role + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (uVar3 < (ulong)(pQVar2->values).d.size);
  }
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
            )this;
}

Assistant:

QMap<int, QVariant> QTableModel::itemData(const QModelIndex &index) const
{
    QMap<int, QVariant> roles;
    QTableWidgetItem *itm = item(index);
    if (itm) {
        for (int i = 0; i < itm->values.size(); ++i) {
            roles.insert(itm->values.at(i).role,
                         itm->values.at(i).value);
        }
    }
    return roles;
}